

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O0

void __thiscall Js::ScriptContext::ClearRejitReasonCountsArray(ScriptContext *this)

{
  ushort local_14;
  ushort local_12;
  UINT16 i_1;
  UINT16 i;
  ScriptContext *this_local;
  
  if (this->rejitReasonCounts != (uint *)0x0) {
    for (local_12 = 0; local_12 < 0x2d; local_12 = local_12 + 1) {
      this->rejitReasonCounts[local_12] = 0;
    }
  }
  if (this->rejitReasonCountsCap != (uint *)0x0) {
    for (local_14 = 0; local_14 < 0x2d; local_14 = local_14 + 1) {
      this->rejitReasonCountsCap[local_14] = 0;
    }
  }
  return;
}

Assistant:

void ScriptContext::ClearRejitReasonCountsArray()
    {
        if (this->rejitReasonCounts != nullptr)
        {
            for (UINT16 i = 0; i < NumRejitReasons; i++)
            {
                this->rejitReasonCounts[i] = 0;
            }
        }
        if (this->rejitReasonCountsCap != nullptr)
        {
            for (UINT16 i = 0; i < NumRejitReasons; i++)
            {
                this->rejitReasonCountsCap[i] = 0;
            }
        }
    }